

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O2

vec2 vec2_perpindicular_component(vec2 u,vec2 v)

{
  vec2 vVar1;
  vec2 vVar2;
  undefined4 local_18;
  undefined4 uStack_14;
  
  vVar2 = vec2_parallel_component(u,v);
  local_18 = u.x;
  uStack_14 = u.y;
  vVar1.y = uStack_14 - vVar2.y;
  vVar1.x = local_18 - vVar2.x;
  return vVar1;
}

Assistant:

vec2 vec2_perpindicular_component(vec2 u, vec2 v) {
    return vec2_sub(u, vec2_parallel_component(u, v));
}